

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

natwm_error string_split(char *string,char delimiter,char ***result,size_t *length)

{
  _Bool _Var1;
  char *data;
  void *pvVar2;
  node *local_78;
  node *item_2;
  node *item_1;
  size_t items_index;
  char **items;
  char *last_item;
  size_t delimiter_pos;
  char *item;
  list *plStack_38;
  natwm_error err;
  list *found_items;
  size_t *length_local;
  char ***result_local;
  char *pcStack_18;
  char delimiter_local;
  char *string_local;
  
  found_items = (list *)length;
  length_local = (size_t *)result;
  result_local._7_1_ = delimiter;
  pcStack_18 = string;
  plStack_38 = list_create();
  if (plStack_38 == (list *)0x0) {
    return MEMORY_ALLOCATION_ERROR;
  }
  item._4_4_ = GENERIC_ERROR;
  while( true ) {
    delimiter_pos = 0;
    last_item = (char *)0x0;
    item._4_4_ = string_get_delimiter
                           (pcStack_18,result_local._7_1_,(char **)&delimiter_pos,
                            (size_t *)&last_item,false);
    if (item._4_4_ == NOT_FOUND_ERROR) break;
    if (item._4_4_ != NO_ERROR) goto LAB_00110b5f;
    list_insert(plStack_38,(void *)delimiter_pos);
    pcStack_18 = last_item + 1 + (long)pcStack_18;
  }
  data = string_init(pcStack_18);
  if (data != (char *)0x0) {
    list_insert(plStack_38,data);
    _Var1 = list_is_empty(plStack_38);
    if (_Var1) {
      return NOT_FOUND_ERROR;
    }
    pvVar2 = malloc(plStack_38->size << 3);
    if (pvVar2 != (void *)0x0) {
      item_1 = (node *)plStack_38->size;
      for (item_2 = plStack_38->head; item_1 = (node *)((long)&item_1[-1].data + 7),
          item_2 != (node *)0x0; item_2 = item_2->next) {
        *(void **)((long)pvVar2 + (long)item_1 * 8) = item_2->data;
      }
      *length_local = (size_t)pvVar2;
      found_items->head = (node *)plStack_38->size;
      list_destroy(plStack_38);
      return NO_ERROR;
    }
  }
LAB_00110b5f:
  for (local_78 = plStack_38->head; local_78 != (node *)0x0; local_78 = local_78->next) {
    if ((local_78 != (node *)0x0) && (local_78->data != (void *)0x0)) {
      free(local_78->data);
    }
  }
  list_destroy(plStack_38);
  return item._4_4_;
}

Assistant:

enum natwm_error string_split(const char *string, char delimiter, char ***result, size_t *length)
{
        // We will create a list of each item we find, then push them all
        // into an array once we find the total number
        struct list *found_items = list_create();

        if (found_items == NULL) {
                return MEMORY_ALLOCATION_ERROR;
        }

        enum natwm_error err = GENERIC_ERROR;

        for (;;) {
                char *item = NULL;
                size_t delimiter_pos = 0;
                err = string_get_delimiter(string, delimiter, &item, &delimiter_pos, false);

                if (err == NOT_FOUND_ERROR) {
                        // There are no more delimiters in the string, but we
                        // still need to consume the last item
                        char *last_item = string_init(string);

                        if (last_item == NULL) {
                                goto free_and_error;
                        }

                        list_insert(found_items, last_item);

                        break;
                } else if (err != NO_ERROR) {
                        // We have an actual error
                        goto free_and_error;
                }

                list_insert(found_items, item);

                string += ++delimiter_pos;
        }

        if (list_is_empty(found_items)) {
                return NOT_FOUND_ERROR;
        }

        // We should now have a list of items. We can now make an array of them
        char **items = malloc(sizeof(char *) * found_items->size);

        if (items == NULL) {
                goto free_and_error;
        }

        // Walk the list backwards to store the strings in order
        size_t items_index = (found_items->size - 1);

        LIST_FOR_EACH(found_items, item)
        {
                items[items_index] = (char *)item->data;

                --items_index;
        }

        *result = items;
        *length = found_items->size;

        // We have no need for this list anymore
        list_destroy(found_items);

        return NO_ERROR;

free_and_error:
        // We need to make sure to cleanup any memory allocated while finding
        // items before we return an error
        LIST_FOR_EACH(found_items, item)
        {
                if (item && item->data != NULL) {
                        free((char *)item->data);
                }
        }

        list_destroy(found_items);

        return err;
}